

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPCEncoder.cpp
# Opt level: O1

bool __thiscall gnilk::IPCBinaryEncoder::BeginArray(IPCBinaryEncoder *this,uint16_t num)

{
  IPCArrayHeader arrayHeader;
  undefined1 local_4 [4];
  
  (**(this->super_IPCEncoderBase).super_IPCWriter._vptr_IPCWriter)(this,local_4,4);
  return true;
}

Assistant:

bool IPCBinaryEncoder::BeginArray(uint16_t num) {
    IPCArrayHeader arrayHeader;
    arrayHeader.headerVersion = kMsgVer_Current;
    arrayHeader.reserved = 0;
    arrayHeader.num = num;
    Write(&arrayHeader, sizeof(arrayHeader));
    return true;
}